

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.c
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  Filetree tree_00;
  int local_3c;
  int local_38;
  int ret;
  int mode_parsed;
  int mode;
  Filetree tree;
  GSList *files;
  GSList *errors;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  files = (GSList *)0x0;
  tree = (Filetree)0x0;
  bVar1 = false;
  local_38 = 0;
  local_3c = 0;
  errors = (GSList *)argv;
  argv_local._0_4_ = argc;
  iVar2 = parse_global_args((int *)&argv_local,(char ***)&errors,entries,1);
  if (((iVar2 != 0) || ((int)argv_local < 2)) || (help != 0)) {
    print_help();
    exit(1);
  }
  iVar2 = strcmp((char *)errors->next,"scan");
  if (iVar2 == 0) {
    bVar1 = false;
    local_38 = loudness_scan_parse((int *)&argv_local,(char ***)&errors);
  }
  else {
    iVar2 = strcmp((char *)errors->next,"dump");
    if (iVar2 == 0) {
      bVar1 = true;
      local_38 = loudness_dump_parse((int *)&argv_local,(char ***)&errors);
    }
    else {
      iVar2 = strcmp((char *)errors->next,"--version");
      if (iVar2 == 0) {
        print_version();
        exit(0);
      }
      fprintf(_stderr,"Unknown mode \'%s\'\n",errors->next);
    }
  }
  if (local_38 != 0) {
    if ((decode_to_file != (gchar *)0x0) && ((int)argv_local != 2)) {
      fprintf(_stderr,"Cannot decode more than one file\n");
      exit(1);
    }
    input_init((char *)errors->data,forced_plugin);
    scanner_init_common();
    setlocale(3,"");
    setlocale(0,"");
    tree_00 = filetree_init((char **)&errors->next,(long)((int)argv_local + -1),recursive,
                            follow_symlinks,no_sort,&files);
    g_slist_foreach(files,filetree_print_error,&verbose);
    g_slist_foreach(files,filetree_free_error,0);
    g_slist_free(files);
    filetree_file_list(tree_00,(GSList **)&tree);
    filetree_remove_common_prefix((GSList *)tree);
    if (bVar1) {
      if (bVar1) {
        local_3c = loudness_dump((GSList *)tree);
      }
    }
    else {
      loudness_scan((GSList *)tree);
    }
    g_slist_foreach(tree,filetree_free_list_entry,0);
    g_slist_free(tree);
    filetree_destroy(tree_00);
    input_deinit();
    g_free(forced_plugin);
    return local_3c;
  }
  exit(1);
}

Assistant:

int
main(int argc, char *argv[])
{
	GSList *errors = NULL;
	GSList *files = NULL;
	Filetree tree;
	int mode = 0;
	int mode_parsed = FALSE;
	int ret = 0;

	if (parse_global_args(&argc, &argv, entries, TRUE) || argc < 2 ||
	    help) {
		print_help();
		exit(EXIT_FAILURE);
	}
	if (!strcmp(argv[1], "scan")) {
		mode = LOUDNESS_MODE_SCAN;
		mode_parsed = loudness_scan_parse(&argc, &argv);
#ifdef USE_TAGLIB
	} else if (!strcmp(argv[1], "tag")) {
		mode = LOUDNESS_MODE_TAG;
		mode_parsed = loudness_tag_parse(&argc, &argv);
#endif
	} else if (!strcmp(argv[1], "dump")) {
		mode = LOUDNESS_MODE_DUMP;
		mode_parsed = loudness_dump_parse(&argc, &argv);
	} else if (!strcmp(argv[1], "--version")) {
		print_version();
		exit(EXIT_SUCCESS);
	} else {
		fprintf(stderr, "Unknown mode '%s'\n", argv[1]);
	}
	if (!mode_parsed) {
		exit(EXIT_FAILURE);
	}
	if (decode_to_file && argc - 1 != 1) {
		fprintf(stderr, "Cannot decode more than one file\n");
		exit(EXIT_FAILURE);
	}

	input_init(argv[0], forced_plugin);
	scanner_init_common();

	setlocale(LC_COLLATE, "");
	setlocale(LC_CTYPE, "");
	tree = filetree_init(&argv[1], (size_t)(argc - 1), recursive,
	    follow_symlinks, no_sort, &errors);

	g_slist_foreach(errors, filetree_print_error, &verbose);
	g_slist_foreach(errors, filetree_free_error, NULL);
	g_slist_free(errors);

	filetree_file_list(tree, &files);
	filetree_remove_common_prefix(files);

	switch (mode) {
	case LOUDNESS_MODE_SCAN:
		loudness_scan(files);
		break;
#ifdef USE_TAGLIB
	case LOUDNESS_MODE_TAG:
		ret = loudness_tag(files);
		break;
#endif
	case LOUDNESS_MODE_DUMP:
		ret = loudness_dump(files);
		break;
	}

	g_slist_foreach(files, filetree_free_list_entry, NULL);
	g_slist_free(files);

	filetree_destroy(tree);
	input_deinit();
	g_free(forced_plugin);

	return ret;
}